

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exchange_dt.h
# Opt level: O0

void __thiscall Packer::unpack(Packer *this,double packed,int *coords)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  longlong c3;
  longlong c2;
  longlong c1;
  longlong ipacked;
  int *coords_local;
  double packed_local;
  Packer *this_local;
  
  lVar5 = (long)packed;
  lVar1 = this->iscale;
  lVar2 = this->iscale;
  lVar3 = this->iscale;
  lVar4 = this->iscale;
  *coords = (int)(lVar5 % this->iscale);
  coords[1] = (int)((lVar5 / lVar1) % lVar2);
  coords[2] = (int)(lVar5 / (lVar3 * lVar4));
  return;
}

Assistant:

inline void unpack(double packed, int coords[3]) const
    {
        // When unpacking our value, we need to use exact-precision integer
        // division and modulo. However, our packed value can take up to 53
        // bits, so we need long long ints (64 bits).
        long long int ipacked = (long long int)packed;
        // we carry out exact operations with long long int precision.
        long long int c1 = ipacked % iscale;
        long long int c2 = (ipacked / iscale) % iscale;
        long long int c3 = ipacked / (iscale * iscale);
        // and then convert the results to int (we know they can fit an int as
        // they were integers originally).
        coords[0] = (int)c1;
        coords[1] = (int)c2;
        coords[2] = (int)c3;
    }